

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O1

uint32_t __thiscall Crc32::Reverse(Crc32 *this,uint32_t value)

{
  uint uVar1;
  
  uVar1 = value >> 0x18 | (value & 0xff0000) >> 8 | (value & 0xff00) << 8 | value << 0x18;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | uVar1 >> 4 & 0xf0f0f0f;
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333) * 4;
  return (uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2;
}

Assistant:

uint32_t Crc32::Reverse(uint32_t value) const
{
  value = ((value & 0xAAAAAAAA) >> 1) | ((value & 0x55555555) << 1);
  value = ((value & 0xCCCCCCCC) >> 2) | ((value & 0x33333333) << 2);
  value = ((value & 0xF0F0F0F0) >> 4) | ((value & 0x0F0F0F0F) << 4);
  value = ((value & 0xFF00FF00) >> 8) | ((value & 0x00FF00FF) << 8);
  value = (value >> 16) | (value << 16);

  return value;
}